

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O2

void __thiscall QSocks5SocketEnginePrivate::reauthenticate(QSocks5SocketEnginePrivate *this)

{
  QNetworkProxy *proxy;
  QAbstractSocketEngine *this_00;
  QSocks5Authenticator *pQVar1;
  QTcpSocket *pQVar2;
  quint16 qVar3;
  QSocks5PasswordAuthenticator *this_01;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_68;
  QAuthenticator auth;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractSocketEngine **)&(this->super_QAbstractSocketEnginePrivate).field_0x8;
  auth.d = (QAuthenticatorPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QAuthenticator::QAuthenticator(&auth);
  proxy = &this->proxyInfo;
  QAbstractSocketEngine::proxyAuthenticationRequired(this_00,proxy,&auth);
  QAuthenticator::user((QString *)&local_48,&auth);
  if (local_48.size == 0) {
    QAuthenticator::password((QString *)&QStack_68,&auth);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    if (QStack_68.size == 0) {
      local_48.d = (Data *)0x0;
      local_48.ptr = (char16_t *)0x0;
      local_48.size = 0;
      setErrorState(this,AuthenticatingError,(QString *)&local_48);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
      (**(code **)(*(long *)&this->data->controlSocket->super_QAbstractSocket + 0x70))();
      emitConnectionNotification(this);
      goto LAB_0021f5a4;
    }
  }
  else {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  }
  this->socks5State = Uninitialized;
  pQVar1 = this->data->authenticator;
  if (pQVar1 != (QSocks5Authenticator *)0x0) {
    (*pQVar1->_vptr_QSocks5Authenticator[1])();
  }
  QAuthenticator::user((QString *)&local_48,&auth);
  QNetworkProxy::setUser(proxy,(QString *)&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  QAuthenticator::password((QString *)&local_48,&auth);
  QNetworkProxy::setPassword(proxy,(QString *)&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  this_01 = (QSocks5PasswordAuthenticator *)operator_new(0x38);
  QNetworkProxy::user((QString *)&local_48,proxy);
  QNetworkProxy::password((QString *)&QStack_68,proxy);
  QSocks5PasswordAuthenticator::QSocks5PasswordAuthenticator
            (this_01,(QString *)&local_48,(QString *)&QStack_68);
  this->data->authenticator = (QSocks5Authenticator *)this_01;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QSignalBlocker::QSignalBlocker((QSignalBlocker *)&local_48,(QObject *)this->data->controlSocket);
  QAbstractSocket::abort(&this->data->controlSocket->super_QAbstractSocket);
  QSignalBlocker::~QSignalBlocker((QSignalBlocker *)&local_48);
  pQVar2 = this->data->controlSocket;
  QNetworkProxy::hostName((QString *)&local_48,proxy);
  qVar3 = QNetworkProxy::port(proxy);
  (**(code **)(*(long *)&pQVar2->super_QAbstractSocket + 0xf8))(pQVar2,&local_48,qVar3,3,2);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
LAB_0021f5a4:
  QAuthenticator::~QAuthenticator(&auth);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSocks5SocketEnginePrivate::reauthenticate()
{
    Q_Q(QSocks5SocketEngine);

    // we require authentication
    QAuthenticator auth;
    q->proxyAuthenticationRequired(proxyInfo, &auth);

    if (!auth.user().isEmpty() || !auth.password().isEmpty()) {
        // we have new credentials, let's try again
        QSOCKS5_DEBUG << "authentication failure: retrying connection";
        socks5State = QSocks5SocketEnginePrivate::Uninitialized;

        delete data->authenticator;
        proxyInfo.setUser(auth.user());
        proxyInfo.setPassword(auth.password());
        data->authenticator = new QSocks5PasswordAuthenticator(proxyInfo.user(), proxyInfo.password());

        {
            const QSignalBlocker blocker(data->controlSocket);
            data->controlSocket->abort();
        }
        data->controlSocket->connectToHost(proxyInfo.hostName(), proxyInfo.port());
    } else {
        // authentication failure

        setErrorState(AuthenticatingError);
        data->controlSocket->close();
        emitConnectionNotification();
    }
}